

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O3

string * format_abi_cxx11_(string *__return_storage_ptr__,char value)

{
  stringstream s;
  char local_199;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_199 = value;
  std::__ostream_insert<char,std::char_traits<char>>(local_188,&local_199,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (char value)
{
  std::stringstream s;
  s << value;
  return s.str ();
}